

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void fill_pair_matrices(vrna_md_t *md)

{
  int iVar1;
  int local_18;
  int local_14;
  int j;
  int i;
  vrna_md_t *md_local;
  
  for (local_14 = 0; local_14 < 0x15; local_14 = local_14 + 1) {
    memset(md->pair + local_14,0,0x54);
  }
  md->alias[0xd] = 0;
  md->alias[0xe] = 0;
  md->alias[0xf] = 0;
  md->alias[0x10] = 0;
  md->alias[0x11] = 0;
  md->alias[0x12] = 0;
  md->alias[0x13] = 0;
  md->alias[0x14] = 0;
  md->alias[8] = 0;
  md->alias[9] = 0;
  md->alias[10] = 0;
  md->alias[0xb] = 0;
  md->alias[0xc] = 0;
  md->alias[0xd] = 0;
  md->alias[0xe] = 0;
  md->alias[0xf] = 0;
  md->alias[0] = 0;
  md->alias[1] = 0;
  md->alias[2] = 0;
  md->alias[3] = 0;
  md->alias[4] = 0;
  md->alias[5] = 0;
  md->alias[6] = 0;
  md->alias[7] = 0;
  switch(md->energy_set) {
  case 0:
    prepare_default_pairs(md);
    break;
  case 1:
    local_14 = 1;
    while (local_14 < 0x14) {
      iVar1 = local_14 + 1;
      md->alias[local_14] = 3;
      local_14 = local_14 + 2;
      md->alias[iVar1] = 2;
    }
    for (local_14 = 1; local_14 < 0x14; local_14 = local_14 + 2) {
      md->pair[local_14][local_14 + 1] = 2;
      md->pair[local_14 + 1][local_14] = 1;
    }
    break;
  case 2:
    local_14 = 1;
    while (local_14 < 0x14) {
      iVar1 = local_14 + 1;
      md->alias[local_14] = 1;
      local_14 = local_14 + 2;
      md->alias[iVar1] = 4;
    }
    for (local_14 = 1; local_14 < 0x14; local_14 = local_14 + 2) {
      md->pair[local_14][local_14 + 1] = 5;
      md->pair[local_14 + 1][local_14] = 6;
    }
    break;
  case 3:
    local_14 = 1;
    while (local_14 < 0x12) {
      md->alias[local_14] = 3;
      md->alias[local_14 + 1] = 2;
      iVar1 = local_14 + 3;
      md->alias[local_14 + 2] = 1;
      local_14 = local_14 + 4;
      md->alias[iVar1] = 4;
    }
    for (local_14 = 1; local_14 < 0x12; local_14 = local_14 + 4) {
      md->pair[local_14][local_14 + 1] = 2;
      md->pair[local_14 + 1][local_14] = 1;
      md->pair[local_14 + 2][local_14 + 3] = 5;
      md->pair[local_14 + 3][local_14 + 2] = 6;
    }
    break;
  default:
    vrna_message_warning
              ("vrna_md_update: Unknown energy_set = %d. Using defaults!",
               (ulong)(uint)md->energy_set);
    md->energy_set = 0;
    prepare_default_pairs(md);
  }
  for (local_14 = 0; local_14 < 0x15; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 0x15; local_18 = local_18 + 1) {
      md->rtype[md->pair[local_14][local_18]] = md->pair[local_18][local_14];
    }
  }
  md->rtype[0] = 0;
  md->rtype[7] = 7;
  return;
}

Assistant:

PRIVATE void
fill_pair_matrices(vrna_md_t *md)
{
  int i, j;

  /* nullify everything */
  for (i = 0; i <= MAXALPHA; i++)
    memset(md->pair[i], 0, (MAXALPHA + 1) * sizeof(int));

  memset(md->alias, 0, (MAXALPHA + 1) * sizeof(short));

  /* start setting actual base pair type encodings */
  switch (md->energy_set) {
    case  0:
      prepare_default_pairs(md);
      break;

    case 1:
      for (i = 1; i < MAXALPHA;) {
        md->alias[i++]  = 3;            /* A <-> G */
        md->alias[i++]  = 2;            /* B <-> C */
      }
      for (i = 1; i < MAXALPHA; i++) {
        md->pair[i][i + 1] = 2;             /* AB <-> GC */
        i++;
        md->pair[i][i - 1] = 1;             /* BA <-> CG */
      }

      break;

    case 2:
      for (i = 1; i < MAXALPHA;) {
        md->alias[i++]  = 1;            /* A <-> A*/
        md->alias[i++]  = 4;            /* B <-> U */
      }
      for (i = 1; i < MAXALPHA; i++) {
        md->pair[i][i + 1] = 5;             /* AB <-> AU */
        i++;
        md->pair[i][i - 1] = 6;             /* BA <-> UA */
      }

      break;

    case 3:
      for (i = 1; i < MAXALPHA - 2;) {
        md->alias[i++]  = 3;            /* A <-> G */
        md->alias[i++]  = 2;            /* B <-> C */
        md->alias[i++]  = 1;            /* C <-> A */
        md->alias[i++]  = 4;            /* D <-> U */
      }
      for (i = 1; i < MAXALPHA - 2; i++) {
        md->pair[i][i + 1] = 2;             /* AB <-> GC */
        i++;
        md->pair[i][i - 1] = 1;             /* BA <-> CG */
        i++;
        md->pair[i][i + 1] = 5;             /* CD <-> AU */
        i++;
        md->pair[i][i - 1] = 6;             /* DC <-> UA */
      }

      break;

    default:
      vrna_message_warning("vrna_md_update: "
                           "Unknown energy_set = %d. "
                           "Using defaults!",
                           md->energy_set);
      md->energy_set = 0;
      prepare_default_pairs(md);
      break;
  }

  /* set the reverse base pair types */
  for (i = 0; i <= MAXALPHA; i++)
    for (j = 0; j <= MAXALPHA; j++)
      md->rtype[md->pair[i][j]] = md->pair[j][i];

  /* handle special cases separately */
  md->rtype[0]  = 0;
  md->rtype[7]  = 7;

  /* was used for energy_set == 0
   * for(i = 0; i < NBASES; i++)
   *  for(j = 0; j < NBASES; j++)
   *   md->rtype[md->pair[i][j]] = md->pair[j][i];
   */
}